

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char[67],std::__cxx11::string,char[93],std::__cxx11::string,char[19],std::__cxx11::string,char[14],std::__cxx11::string,char[19],std::__cxx11::string,char[13]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [67],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [93],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
                   char (*args_4) [19],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,
                   char (*args_6) [14],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_7,
                   char (*args_8) [19],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_9,
                   char (*args_10) [13])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmAlphaNum local_328;
  cmAlphaNum local_2f8;
  cmAlphaNum local_2c8;
  cmAlphaNum local_298;
  cmAlphaNum local_268;
  cmAlphaNum local_238;
  cmAlphaNum local_208;
  cmAlphaNum local_1d8;
  cmAlphaNum local_1a8;
  cmAlphaNum local_178;
  cmAlphaNum local_148;
  string_view local_118;
  string_view local_108;
  string_view local_f8;
  string_view local_e8;
  string_view local_d8;
  string_view local_c8;
  string_view local_b8;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  iterator local_48;
  undefined8 local_40;
  char (*local_38) [93];
  char (*args_local_2) [93];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char (*args_local) [67];
  cmAlphaNum *b_local;
  cmAlphaNum *a_local;
  
  local_38 = args_2;
  args_local_2 = (char (*) [93])args_1;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  args_local = (char (*) [67])b;
  b_local = a;
  a_local = (cmAlphaNum *)__return_storage_ptr__;
  local_118 = cmAlphaNum::View(a);
  local_108 = cmAlphaNum::View((cmAlphaNum *)args_local);
  cmAlphaNum::cmAlphaNum(&local_148,(char *)args_local_1);
  local_f8 = cmAlphaNum::View(&local_148);
  cmAlphaNum::cmAlphaNum(&local_178,(string *)args_local_2);
  local_e8 = cmAlphaNum::View(&local_178);
  cmAlphaNum::cmAlphaNum(&local_1a8,*local_38);
  local_d8 = cmAlphaNum::View(&local_1a8);
  cmAlphaNum::cmAlphaNum(&local_1d8,args_3);
  local_c8 = cmAlphaNum::View(&local_1d8);
  cmAlphaNum::cmAlphaNum(&local_208,*args_4);
  local_b8 = cmAlphaNum::View(&local_208);
  cmAlphaNum::cmAlphaNum(&local_238,args_5);
  local_a8 = cmAlphaNum::View(&local_238);
  cmAlphaNum::cmAlphaNum(&local_268,*args_6);
  local_98 = cmAlphaNum::View(&local_268);
  cmAlphaNum::cmAlphaNum(&local_298,args_7);
  local_88 = cmAlphaNum::View(&local_298);
  cmAlphaNum::cmAlphaNum(&local_2c8,*args_8);
  local_78 = cmAlphaNum::View(&local_2c8);
  cmAlphaNum::cmAlphaNum(&local_2f8,args_9);
  local_68 = cmAlphaNum::View(&local_2f8);
  cmAlphaNum::cmAlphaNum(&local_328,*args_10);
  local_58 = cmAlphaNum::View(&local_328);
  local_48 = &local_118;
  local_40 = 0xd;
  views._M_len = 0xd;
  views._M_array = local_48;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}